

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemUtils.cpp
# Opt level: O0

string * ApprovalTests::SystemUtils::safeGetEnvForNonWindows_abi_cxx11_(char *name)

{
  char *pcVar1;
  char *in_RSI;
  string *in_RDI;
  char *p;
  allocator local_19;
  char *local_18;
  
  local_18 = (char *)0x0;
  pcVar1 = getenv(in_RSI);
  local_18 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    ::std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_19);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return in_RDI;
}

Assistant:

std::string SystemUtils::safeGetEnvForNonWindows(const char* name)
    {
        APPROVAL_TESTS_UNUSED(name);
        char* p = nullptr;
#ifndef _WIN32
        p = getenv(name);
#endif
        return (p != nullptr) ? p : std::string();
    }